

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContinuumDruckerPrager::ArchiveOUT
          (ChContinuumDruckerPrager *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_a8;
  ChNameValue<double> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::fea::ChContinuumDruckerPrager>(marchive);
  ChContinuumElastoplastic::ArchiveOUT(&this->super_ChContinuumElastoplastic,marchive);
  local_30._value = &this->elastic_yeld;
  local_30._name = "this->elastic_yeld";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->alpha;
  local_48._name = "this->alpha";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->dilatancy;
  local_60._name = "this->dilatancy";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->hardening_speed;
  local_78._name = "this->hardening_speed";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  local_90._value = &this->hardening_limit;
  local_90._name = "this->hardening_limit";
  local_90._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_90);
  local_a8._value = &this->flow_rate;
  local_a8._name = "this->flow_rate";
  local_a8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_a8);
  return;
}

Assistant:

void ChContinuumDruckerPrager::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChContinuumDruckerPrager>();
    // serialize parent class
    ChContinuumElastoplastic::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(this->elastic_yeld);
    marchive << CHNVP(this->alpha);
    marchive << CHNVP(this->dilatancy);
    marchive << CHNVP(this->hardening_speed);
    marchive << CHNVP(this->hardening_limit);
    marchive << CHNVP(this->flow_rate);
}